

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall
HBT_correlation::combine_and_bin_particle_pairs
          (HBT_correlation *this,vector<int,_std::allocator<int>_> *event_list)

{
  pretty_ostream *ppVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar5;
  pointer puVar6;
  double dVar7;
  double dVar8;
  ostream *this_00;
  long lVar9;
  unsigned_long_long *puVar10;
  long lVar11;
  int iVar12;
  anon_struct_120_15_f999644b *paVar13;
  iterator iVar14;
  int iVar15;
  ulong unaff_R13;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined8 uVar38;
  double dVar39;
  undefined8 uVar40;
  double dVar41;
  undefined8 uVar42;
  double dVar43;
  vector<particle_info,_std::allocator<particle_info>_> temp_particle_list;
  anon_struct_120_15_f999644b *local_1b8;
  iterator iStack_1b0;
  anon_struct_120_15_f999644b *local_1a8;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  ostream *local_178;
  double local_170;
  double local_168;
  vector<int,_std::allocator<int>_> *local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double local_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  long local_120;
  long local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  string local_e8;
  string local_c8;
  anon_struct_120_15_f999644b local_a8;
  
  bVar22 = 0;
  local_1b8 = (anon_struct_120_15_f999644b *)0x0;
  iStack_1b0._M_current = (anon_struct_120_15_f999644b *)0x0;
  local_1a8 = (anon_struct_120_15_f999644b *)0x0;
  local_160 = event_list;
  dVar7 = tanh(this->Krap_max_);
  dVar8 = tanh(this->Krap_min_);
  iVar15 = this->number_of_oversample_events_;
  if (iVar15 < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    do {
      unaff_R13 = (ulong)(local_160->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
      pvVar5 = (((this->particle_list).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                particle_list->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[unaff_R13];
      uVar16 = (int)((long)*(pointer *)
                            ((long)&pvVar5->
                                    super__Vector_base<particle_info,_std::allocator<particle_info>_>
                            + 8) -
                     *(long *)&pvVar5->
                               super__Vector_base<particle_info,_std::allocator<particle_info>_> >>
                    3) * -0x11111111;
      if (0 < (int)uVar16) {
        uVar19 = (ulong)(uVar16 & 0x7fffffff);
        lVar21 = 0x50;
        do {
          lVar9 = *(long *)&(((this->particle_list).
                              super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->particle_list->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[unaff_R13]->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_>;
          pdVar2 = (double *)(lVar9 + -0x28 + lVar21);
          dVar27 = *pdVar2;
          dVar32 = pdVar2[1];
          dVar25 = dVar27 / dVar32;
          if ((dVar8 < dVar25) && (dVar25 < dVar7)) {
            local_a8.pz = dVar27;
            local_a8.E = dVar32;
            local_a8.px = *(double *)(lVar9 + -0x38 + lVar21);
            local_a8.py = *(double *)(lVar9 + -0x30 + lVar21);
            local_a8.mass = *(double *)(lVar9 + -0x48 + lVar21);
            local_a8.x = *(double *)(lVar9 + -0x18 + lVar21);
            local_a8.y = *(double *)(lVar9 + -0x10 + lVar21);
            local_a8.z = *(double *)(lVar9 + -8 + lVar21);
            local_a8.t = *(double *)(lVar9 + lVar21);
            if (iStack_1b0._M_current == local_1a8) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>
                        ((vector<particle_info,std::allocator<particle_info>> *)&local_1b8,
                         iStack_1b0,&local_a8);
            }
            else {
              paVar13 = &local_a8;
              iVar14._M_current = iStack_1b0._M_current;
              for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
                uVar23 = *(undefined4 *)&paVar13->field_0x4;
                (iVar14._M_current)->monval = paVar13->monval;
                *(undefined4 *)&(iVar14._M_current)->field_0x4 = uVar23;
                paVar13 = (anon_struct_120_15_f999644b *)((long)paVar13 + (ulong)bVar22 * -0x10 + 8)
                ;
                iVar14._M_current = iVar14._M_current + (ulong)bVar22 * -0x10 + 8;
              }
              iStack_1b0._M_current = iStack_1b0._M_current + 1;
            }
          }
          lVar21 = lVar21 + 0x78;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        iVar15 = this->number_of_oversample_events_;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar15);
    lVar11 = (long)iStack_1b0._M_current - (long)local_1b8;
  }
  ppVar1 = &this->messager;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppVar1,"number of pairs: ",0x11);
  lVar21 = (lVar11 >> 3) * -0x1111111111111111;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)ppVar1);
  local_178 = (ostream *)ppVar1;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"info","");
  pretty_ostream::flush((pretty_ostream *)local_178,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (0 < lVar11) {
    local_160 = (vector<int,_std::allocator<int>_> *)(this->KT_min * this->KT_min);
    local_f0 = this->KT_max * this->KT_max;
    lVar11 = 1;
    local_120 = 1;
    if (1 < lVar21) {
      local_120 = lVar21;
    }
    lVar9 = 0;
    do {
      lVar20 = lVar9 + 1;
      local_118 = lVar11;
      if (lVar20 < lVar21) {
        dVar7 = local_1b8[lVar9].px;
        dVar8 = local_1b8[lVar9].py;
        local_140 = local_1b8[lVar9].pz;
        local_148 = local_1b8[lVar9].E;
        local_f8 = local_1b8[lVar9].x;
        local_100 = local_1b8[lVar9].y;
        local_108 = local_1b8[lVar9].z;
        local_110 = local_1b8[lVar9].t;
        uVar19 = unaff_R13;
        do {
          dVar25 = (dVar7 + local_1b8[lVar11].px) * 0.5;
          dVar32 = (dVar8 + local_1b8[lVar11].py) * 0.5;
          dVar27 = dVar25 * dVar25 + dVar32 * dVar32;
          unaff_R13 = uVar19;
          if (((double)local_160 <= dVar27) && (dVar27 <= local_f0)) {
            local_138 = local_1b8[lVar11].pz;
            local_170 = local_1b8[lVar11].E;
            dVar43 = local_1b8[lVar11].z;
            dVar27 = SQRT(dVar27);
            dVar37 = (dVar27 - this->KT_min) / this->dKT;
            dVar3 = local_1b8[lVar11].x;
            dVar35 = dVar7 - local_1b8[lVar11].px;
            dVar33 = dVar8 - local_1b8[lVar11].py;
            dVar34 = local_140 - local_138;
            local_168 = local_148 - local_170;
            dVar30 = ((local_168 * local_168 - dVar35 * dVar35) - dVar33 * dVar33) - dVar34 * dVar34
            ;
            dVar4 = local_1b8[lVar11].y;
            dVar29 = -dVar30;
            uStack_130 = 0;
            unaff_R13 = uVar19 & 0xffffffff;
            uVar16 = (uint)uVar19;
            if (-0.0 < dVar30) {
              local_198 = dVar37;
              local_188 = local_1b8[lVar11].t;
              dVar29 = sqrt(dVar29);
              dVar37 = local_198;
              dVar30 = local_188;
            }
            else {
              dVar29 = SQRT(dVar29);
              dVar30 = local_1b8[lVar11].t;
            }
            iVar15 = (int)dVar37;
            dVar41 = -dVar35;
            uVar42 = 0x8000000000000000;
            dVar39 = -dVar33;
            uVar40 = 0x8000000000000000;
            dVar37 = -dVar34;
            uVar38 = 0x8000000000000000;
            dVar30 = local_110 - dVar30;
            dVar3 = local_f8 - dVar3;
            dVar4 = local_100 - dVar4;
            dVar43 = local_108 - dVar43;
            if (this->invariant_radius_flag_ == 1) {
              puVar6 = (this->number_of_pairs_numerator_KTdiff_qinv_).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar19 = puVar6[iVar15];
              if (uVar19 < this->needed_number_of_pairs * 0x32) {
                dVar28 = this->delta_q * 0.5;
                dVar26 = this->q_min - dVar28;
                if ((dVar26 + 1e-08 < dVar29) && (dVar29 < dVar28 + this->q_max + -1e-08)) {
                  iVar17 = (int)((dVar29 - dVar26) / this->delta_q);
                  puVar6[iVar15] = uVar19 + 1;
                  local_198 = dVar39;
                  uStack_190 = uVar40;
                  local_188 = dVar37;
                  uStack_180 = uVar38;
                  local_158 = dVar41;
                  uStack_150 = uVar42;
                  local_128 = dVar29;
                  dVar29 = cos((dVar37 * dVar43 +
                               dVar39 * dVar4 + local_168 * dVar30 + dVar3 * dVar41) *
                               5.067728853174532);
                  this->correl_1d_inv_num_count[iVar15][iVar17] =
                       this->correl_1d_inv_num_count[iVar15][iVar17] + 1.0;
                  this->q_inv_mean[iVar15][iVar17] = local_128 + this->q_inv_mean[iVar15][iVar17];
                  this->correl_1d_inv_num[iVar15][iVar17] =
                       dVar29 + this->correl_1d_inv_num[iVar15][iVar17];
                  dVar37 = local_188;
                  uVar38 = uStack_180;
                  dVar39 = local_198;
                  uVar40 = uStack_190;
                  dVar41 = local_158;
                  uVar42 = uStack_150;
                }
              }
            }
            dVar36 = dVar35 * (dVar25 / dVar27) + dVar33 * (dVar32 / dVar27);
            dVar29 = this->delta_q;
            uVar23 = SUB84(dVar29,0);
            uVar24 = (undefined4)((ulong)dVar29 >> 0x20);
            dVar35 = dVar29 * 0.5;
            dVar26 = this->q_min - dVar35;
            dVar28 = dVar26 + 1e-08;
            if ((dVar28 <= dVar36) && (dVar31 = this->q_max + dVar35 + -1e-08, dVar36 <= dVar31)) {
              iVar17 = (int)((dVar36 - dVar26) / dVar29);
              if ((iVar17 < this->qnpts) &&
                 (((dVar27 = dVar33 * (dVar25 / dVar27) + (dVar32 / dVar27) * dVar41,
                   dVar28 <= dVar27 && (dVar27 <= dVar31)) &&
                  (iVar18 = (int)((dVar27 - dVar26) / dVar29), iVar18 < this->qnpts)))) {
                if (this->long_comoving_boost == true) {
                  dVar35 = (local_138 + local_140) * 0.5;
                  dVar33 = (local_170 + local_148) * 0.5;
                  dVar29 = dVar33 * dVar33 - dVar35 * dVar35;
                  if (dVar29 < 0.0) {
                    local_198 = dVar39;
                    uStack_190 = uVar40;
                    local_188 = dVar37;
                    uStack_180 = uVar38;
                    local_170 = dVar33;
                    local_158 = dVar41;
                    uStack_150 = uVar42;
                    local_138 = dVar35;
                    dVar29 = sqrt(dVar29);
                    dVar33 = local_170;
                    dVar35 = local_138;
                    dVar37 = local_188;
                    uVar38 = uStack_180;
                    dVar39 = local_198;
                    uVar40 = uStack_190;
                    dVar41 = local_158;
                    uVar42 = uStack_150;
                  }
                  else {
                    dVar29 = SQRT(dVar29);
                  }
                  dVar34 = ((-dVar35 / dVar33) * local_168 + dVar34) * (dVar33 / dVar29);
                  dVar35 = this->delta_q;
                  uVar23 = SUB84(dVar35,0);
                  uVar24 = (undefined4)((ulong)dVar35 >> 0x20);
                  dVar35 = dVar35 * 0.5;
                  dVar26 = this->q_min - dVar35;
                  dVar28 = dVar26 + 1e-08;
                }
                if (((dVar28 <= dVar34) && (dVar34 <= dVar35 + this->q_max + -1e-08)) &&
                   (iVar12 = (int)((dVar34 - dVar26) / (double)CONCAT44(uVar24,uVar23)),
                   iVar12 < this->qnpts)) {
                  if (this->azimuthal_flag_ == 0) {
                    puVar6 = (this->number_of_pairs_numerator_KTdiff).
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar19 = puVar6[iVar15];
                    if (uVar19 <= this->needed_number_of_pairs) {
                      puVar10 = puVar6 + iVar15;
LAB_0011eab3:
                      uVar16 = (uint)unaff_R13;
                      *puVar10 = uVar19 + 1;
                      dVar32 = cos((dVar37 * dVar43 +
                                   dVar39 * dVar4 + local_168 * dVar30 + dVar3 * dVar41) *
                                   5.067728853174532);
                      if (this->azimuthal_flag_ != 0) {
                        this->correl_3d_Kphi_diff_num_count[iVar15][(int)uVar16][iVar17][iVar18]
                        [iVar12] = this->correl_3d_Kphi_diff_num_count[iVar15][(int)uVar16][iVar17]
                                   [iVar18][iVar12] + 1.0;
                        this->q_out_diff_mean[iVar15][(int)uVar16][iVar17][iVar18][iVar12] =
                             dVar36 + this->q_out_diff_mean[iVar15][(int)uVar16][iVar17][iVar18]
                                      [iVar12];
                        this->q_side_diff_mean[iVar15][(int)uVar16][iVar17][iVar18][iVar12] =
                             dVar27 + this->q_side_diff_mean[iVar15][(int)uVar16][iVar17][iVar18]
                                      [iVar12];
                        this->q_long_diff_mean[iVar15][(int)uVar16][iVar17][iVar18][iVar12] =
                             dVar34 + this->q_long_diff_mean[iVar15][(int)uVar16][iVar17][iVar18]
                                      [iVar12];
                        this->correl_3d_Kphi_diff_num[iVar15][(int)uVar16][iVar17][iVar18][iVar12] =
                             dVar32 + this->correl_3d_Kphi_diff_num[iVar15][(int)uVar16][iVar17]
                                      [iVar18][iVar12];
                        goto LAB_0011ed79;
                      }
                      this->correl_3d_num_count[iVar15][iVar17][iVar18][iVar12] =
                           this->correl_3d_num_count[iVar15][iVar17][iVar18][iVar12] + 1.0;
                      this->q_out_mean[iVar15][iVar17][iVar18][iVar12] =
                           dVar36 + this->q_out_mean[iVar15][iVar17][iVar18][iVar12];
                      this->q_side_mean[iVar15][iVar17][iVar18][iVar12] =
                           dVar27 + this->q_side_mean[iVar15][iVar17][iVar18][iVar12];
                      this->q_long_mean[iVar15][iVar17][iVar18][iVar12] =
                           dVar34 + this->q_long_mean[iVar15][iVar17][iVar18][iVar12];
                      this->correl_3d_num[iVar15][iVar17][iVar18][iVar12] =
                           dVar32 + this->correl_3d_num[iVar15][iVar17][iVar18][iVar12];
                    }
                  }
                  else {
                    local_198 = dVar39;
                    uStack_190 = uVar40;
                    local_188 = dVar37;
                    uStack_180 = uVar38;
                    local_158 = dVar41;
                    uStack_150 = uVar42;
                    dVar32 = atan2(dVar32,dVar25);
                    this_00 = local_178;
                    for (dVar32 = dVar32 - this->psi_ref; dVar32 < 0.0;
                        dVar32 = dVar32 + 6.283185307179586) {
                    }
                    for (; 6.283185307179586 < dVar32; dVar32 = dVar32 + -6.283185307179586) {
                    }
                    uVar16 = (uint)(dVar32 / this->dKphi);
                    if (((int)uVar16 < 0) || (this->n_Kphi <= (int)uVar16)) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (local_178,"delta_phi = ",0xc);
                      unaff_R13 = (ulong)uVar16;
                      std::ostream::_M_insert<double>(dVar32);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (this_00," is out of bound of [0, 2pi]! ",0x1e);
                      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Kphi_idx = ",0xb);
                      std::ostream::operator<<(this_00,uVar16);
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"warning","");
                      pretty_ostream::flush((pretty_ostream *)local_178,&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p);
                      }
                      goto LAB_0011ed79;
                    }
                    unaff_R13 = (ulong)uVar16;
                    uVar19 = this->number_of_pairs_numerator_KTKphidiff[iVar15][uVar16];
                    if (uVar19 <= this->needed_number_of_pairs) {
                      puVar10 = this->number_of_pairs_numerator_KTKphidiff[iVar15] + uVar16;
                      dVar37 = local_188;
                      dVar39 = local_198;
                      dVar41 = local_158;
                      goto LAB_0011eab3;
                    }
                  }
                }
              }
            }
            unaff_R13 = (ulong)uVar16;
          }
LAB_0011ed79:
          lVar11 = lVar11 + 1;
          uVar19 = unaff_R13;
        } while (lVar11 < lVar21);
      }
      lVar11 = local_118 + 1;
      lVar9 = lVar20;
    } while (lVar20 != local_120);
  }
  if (iStack_1b0._M_current != local_1b8) {
    iStack_1b0._M_current = local_1b8;
  }
  if (local_1b8 != (anon_struct_120_15_f999644b *)0x0) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

void HBT_correlation::combine_and_bin_particle_pairs(
    std::vector<int> event_list) {
    double hbarC_inv = 1. / hbarC;
    std::vector<particle_info> temp_particle_list;
    double particle_list_rapidity_cut_max = tanh(Krap_max_);
    double particle_list_rapidity_cut_min = tanh(Krap_min_);
    for (int j = 0; j < number_of_oversample_events_; j++) {
        int event_id = event_list[j];
        int event_number_particle =
            (particle_list->get_number_of_particles(event_list[j]));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_E = particle_list->get_particle(event_id, i).E;
            double temp_pz = particle_list->get_particle(event_id, i).pz;
            double temp_ratio = temp_pz / temp_E;
            if (temp_ratio > particle_list_rapidity_cut_min
                && temp_ratio < particle_list_rapidity_cut_max) {
                particle_info temp_particle;
                temp_particle.E = temp_E;
                temp_particle.pz = temp_pz;
                temp_particle.px = particle_list->get_particle(event_id, i).px;
                temp_particle.py = particle_list->get_particle(event_id, i).py;
                temp_particle.mass =
                    (particle_list->get_particle(event_id, i).mass);
                temp_particle.x = particle_list->get_particle(event_id, i).x;
                temp_particle.y = particle_list->get_particle(event_id, i).y;
                temp_particle.z = particle_list->get_particle(event_id, i).z;
                temp_particle.t = particle_list->get_particle(event_id, i).t;
                temp_particle_list.push_back(temp_particle);
            }
        }
    }
    long long int number_of_particles = temp_particle_list.size();
    unsigned long long int number_of_pairs =
        (number_of_particles * (number_of_particles - 1) / 2);

    // nested pair loop
    messager << "number of pairs: " << number_of_pairs;
    messager.flush("info");
    double KT_min_sq = KT_min * KT_min;
    double KT_max_sq = KT_max * KT_max;
    for (int i = 0; i < number_of_particles; i++) {
        double particle_1_px = temp_particle_list[i].px;
        double particle_1_py = temp_particle_list[i].py;
        double particle_1_pz = temp_particle_list[i].pz;
        double particle_1_E = temp_particle_list[i].E;
        double particle_1_x = temp_particle_list[i].x;
        double particle_1_y = temp_particle_list[i].y;
        double particle_1_z = temp_particle_list[i].z;
        double particle_1_t = temp_particle_list[i].t;

        for (int j = i + 1; j < number_of_particles; j++) {
            double particle_2_px = temp_particle_list[j].px;
            double particle_2_py = temp_particle_list[j].py;
            double particle_2_pz = temp_particle_list[j].pz;
            double particle_2_E = temp_particle_list[j].E;
            double particle_2_x = temp_particle_list[j].x;
            double particle_2_y = temp_particle_list[j].y;
            double particle_2_z = temp_particle_list[j].z;
            double particle_2_t = temp_particle_list[j].t;

            double K_z = 0.5 * (particle_1_pz + particle_2_pz);
            double K_E = 0.5 * (particle_1_E + particle_2_E);
            double K_z_over_K_E = K_z / K_E;

            // K_T cut
            double K_x = 0.5 * (particle_1_px + particle_2_px);
            double K_y = 0.5 * (particle_1_py + particle_2_py);
            double K_perp_sq = K_x * K_x + K_y * K_y;
            if (K_perp_sq < KT_min_sq || K_perp_sq > KT_max_sq) {
                continue;
            }

            double K_perp = sqrt(K_perp_sq);
            int Kperp_idx = static_cast<int>((K_perp - KT_min) / dKT);

            // calculate q_inv
            double q_x = particle_1_px - particle_2_px;
            double q_y = particle_1_py - particle_2_py;
            double q_z = particle_1_pz - particle_2_pz;
            double q_E = particle_1_E - particle_2_E;
            double local_q_inv =
                sqrt(-(q_E * q_E - q_x * q_x - q_y * q_y - q_z * q_z));

            double t_diff = particle_1_t - particle_2_t;
            double x_diff = particle_1_x - particle_2_x;
            double y_diff = particle_1_y - particle_2_y;
            double z_diff = particle_1_z - particle_2_z;

            if (invariant_radius_flag_ == 1) {
                if (number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]
                    < 50 * needed_number_of_pairs) {
                    if (local_q_inv > (q_min - delta_q / 2. + 1e-8)
                        && local_q_inv < (q_max + delta_q / 2. - 1e-8)) {
                        int qinv_idx = static_cast<int>(
                            (local_q_inv - (q_min - delta_q / 2.)) / delta_q);
                        number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]++;
                        double cos_qx =
                            cos(hbarC_inv
                                * (q_E * t_diff - q_x * x_diff - q_y * y_diff
                                   - q_z * z_diff));
                        correl_1d_inv_num_count[Kperp_idx][qinv_idx]++;
                        q_inv_mean[Kperp_idx][qinv_idx] += local_q_inv;
                        correl_1d_inv_num[Kperp_idx][qinv_idx] += cos_qx;
                    }
                }
            }

            // calculate qout and qside in lcms
            double cos_K_phi = K_x / K_perp;
            double sin_K_phi = K_y / K_perp;

            double local_q_out = q_x * cos_K_phi + q_y * sin_K_phi;
            if (local_q_out < (q_min - delta_q / 2. + 1e-8)
                || local_q_out > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qout_idx = static_cast<int>(
                (local_q_out - (q_min - delta_q / 2.)) / delta_q);
            if (qout_idx >= qnpts) continue;

            double local_q_side = q_y * cos_K_phi - q_x * sin_K_phi;
            if (local_q_side < (q_min - delta_q / 2. + 1e-8)
                || local_q_side > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qside_idx = static_cast<int>(
                (local_q_side - (q_min - delta_q / 2.)) / delta_q);
            if (qside_idx >= qnpts) continue;

            double local_q_long = q_z;
            if (long_comoving_boost) {
                // calcualte qlong in the lcms
                double Mt = sqrt(K_E * K_E - K_z * K_z);
                double boost_gamma = K_E / Mt;
                double boost_beta = K_z_over_K_E;
                // boost qz to lcms
                local_q_long = boost_gamma * (q_z - boost_beta * q_E);
            }

            if (local_q_long < (q_min - delta_q / 2. + 1e-8)
                || local_q_long > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }
            int qlong_idx = static_cast<int>(
                (local_q_long - (q_min - delta_q / 2.)) / delta_q);
            if (qlong_idx >= qnpts) continue;

            int Kphi_idx;
            if (azimuthal_flag_ == 0) {
                if (number_of_pairs_numerator_KTdiff[Kperp_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTdiff[Kperp_idx]++;
            } else {
                double local_K_phi = atan2(K_y, K_x);
                double delta_phi = local_K_phi - psi_ref;
                while (delta_phi < 0.) {
                    delta_phi += 2. * M_PI;
                }
                while (delta_phi > 2. * M_PI) {
                    delta_phi -= 2. * M_PI;
                }
                Kphi_idx = static_cast<int>(delta_phi / dKphi);
                if (Kphi_idx < 0 || Kphi_idx >= n_Kphi) {
                    messager << "delta_phi = " << delta_phi
                             << " is out of bound of [0, 2pi]! "
                             << "Kphi_idx = " << Kphi_idx;
                    messager.flush("warning");
                    continue;
                }
                if (number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]++;
            }

            double cos_qx = cos(
                hbarC_inv
                * (q_E * t_diff - q_x * x_diff - q_y * y_diff - q_z * z_diff));

            // bin results
            if (azimuthal_flag_ == 0) {
                correl_3d_num_count[Kperp_idx][qout_idx][qside_idx]
                                   [qlong_idx]++;
                q_out_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_out;
                q_side_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_side;
                q_long_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_long;
                correl_3d_num[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    cos_qx;
            } else {
                correl_3d_Kphi_diff_num_count[Kperp_idx][Kphi_idx][qout_idx]
                                             [qside_idx][qlong_idx]++;
                q_out_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                               [qlong_idx] += local_q_out;
                q_side_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_side;
                q_long_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_long;
                correl_3d_Kphi_diff_num[Kperp_idx][Kphi_idx][qout_idx]
                                       [qside_idx][qlong_idx] += cos_qx;
            }
        }
    }
    temp_particle_list.clear();
}